

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_status dump_list_contents_ascii(nbt_list *list,buffer *b,size_t ident)

{
  nbt_status nVar1;
  nbt_status err;
  nbt_list *entry;
  list_head *pos;
  size_t ident_local;
  buffer *b_local;
  nbt_list *list_local;
  
  entry = (nbt_list *)(list->entry).flink;
  while( true ) {
    if (entry == (nbt_list *)&list->entry) {
      return NBT_OK;
    }
    nVar1 = __nbt_dump_ascii((nbt_node *)entry[-1].entry.flink,b,ident);
    if (nVar1 != NBT_OK) break;
    entry = (nbt_list *)(entry->entry).blink;
  }
  return nVar1;
}

Assistant:

static nbt_status dump_list_contents_ascii(const struct nbt_list* list, struct buffer* b, size_t ident)
{
    const struct list_head* pos;

    list_for_each(pos, &list->entry)
    {
        const struct nbt_list* entry = list_entry(pos, const struct nbt_list, entry);
        nbt_status err;

        if((err = __nbt_dump_ascii(entry->data, b, ident)) != NBT_OK)
            return err;
    }

    return NBT_OK;
}